

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.hpp
# Opt level: O0

void __thiscall dxil_spv::OptionDescriptorQA::OptionDescriptorQA(OptionDescriptorQA *this)

{
  OptionDescriptorQA *this_local;
  
  OptionBase::OptionBase(&this->super_OptionBase,DescriptorQA);
  this->enabled = false;
  this->version = 1;
  this->global_desc_set = 0;
  this->global_binding = 0;
  this->heap_desc_set = 0;
  this->heap_binding = 0;
  this->shader_hash = 0;
  return;
}

Assistant:

OptionDescriptorQA()
		: OptionBase(Option::DescriptorQA)
	{
	}